

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O2

Pdr_Set_t * Pdr_ManReduceClause(Pdr_Man_t *p,int k,Pdr_Set_t *pCube)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  Vec_Int_t *p_00;
  ulong uVar4;
  int *piVar5;
  Pdr_Set_t *pCube_00;
  uint uVar6;
  uint uVar7;
  char *__assertion;
  ulong uVar8;
  uint i;
  
  pvVar3 = Vec_PtrEntry(p->vSolvers,k);
  p_00 = Pdr_ManLitsToCube(p,k,*(int **)((long)pvVar3 + 0x138),*(int *)((long)pvVar3 + 0x134));
  uVar6 = p_00->nSize;
  if (uVar6 == pCube->nLits) {
    return (Pdr_Set_t *)0x0;
  }
  if ((int)uVar6 < pCube->nLits) {
    uVar7 = 0;
    for (i = 0; (int)i < (int)uVar6; i = i + 1) {
      uVar1 = Vec_IntEntry(p_00,i);
      uVar6 = p_00->nSize;
      if ((uVar1 & 1) == 0) break;
      uVar7 = uVar7 + 2;
    }
    if (uVar6 == i) {
      uVar8 = 0;
      uVar4 = (ulong)(uint)pCube->nLits;
      if (pCube->nLits < 1) {
        uVar4 = uVar8;
      }
      for (; uVar4 != uVar8; uVar8 = uVar8 + 1) {
        uVar6 = *(uint *)(&pCube->field_0x14 + uVar8 * 4);
        if ((uVar6 & 1) == 0) {
          if (p_00->nCap == i) {
            if (i < 0x10) {
              uVar7 = 0x10;
            }
            if (i < uVar7) {
              if (p_00->pArray == (int *)0x0) {
                piVar5 = (int *)malloc((ulong)uVar7 << 2);
              }
              else {
                piVar5 = (int *)realloc(p_00->pArray,(ulong)uVar7 << 2);
              }
              p_00->pArray = piVar5;
              if (piVar5 == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              p_00->nCap = uVar7;
              i = p_00->nSize;
            }
          }
          p_00->nSize = i + 1;
          p_00->pArray[(int)i] = uVar6;
          if ((int)uVar8 < pCube->nLits) {
            uVar6 = p_00->nSize;
            goto LAB_00475306;
          }
          break;
        }
      }
      __assertion = "i < pCube->nLits";
      uVar6 = 0x6c;
    }
    else {
LAB_00475306:
      pCube_00 = Pdr_SetCreateSubset(pCube,p_00->pArray,uVar6);
      iVar2 = Pdr_SetIsInit(pCube_00,-1);
      if (iVar2 == 0) {
        return pCube_00;
      }
      __assertion = "!Pdr_SetIsInit(pCubeMin, -1)";
      uVar6 = 0x70;
    }
  }
  else {
    __assertion = "Vec_IntSize(vLits) < pCube->nLits";
    uVar6 = 0x5e;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCore.c"
                ,uVar6,"Pdr_Set_t *Pdr_ManReduceClause(Pdr_Man_t *, int, Pdr_Set_t *)");
}

Assistant:

Pdr_Set_t * Pdr_ManReduceClause( Pdr_Man_t * p, int k, Pdr_Set_t * pCube )
{
    Pdr_Set_t * pCubeMin;
    Vec_Int_t * vLits;
    int i, Entry, nCoreLits, * pCoreLits;
    // get relevant SAT literals
    nCoreLits = sat_solver_final(Pdr_ManSolver(p, k), &pCoreLits);
    // translate them into register literals and remove auxiliary
    vLits = Pdr_ManLitsToCube( p, k, pCoreLits, nCoreLits );
    // skip if there is no improvement
    if ( Vec_IntSize(vLits) == pCube->nLits )
        return NULL;
    assert( Vec_IntSize(vLits) < pCube->nLits );
    // if the cube overlaps with init, add any literal
    Vec_IntForEachEntry( vLits, Entry, i )
        if ( lit_sign(Entry) == 0 ) // positive literal
            break;
    if ( i == Vec_IntSize(vLits) ) // only negative literals
    {
        // add the first positive literal
        for ( i = 0; i < pCube->nLits; i++ )
            if ( lit_sign(pCube->Lits[i]) == 0 ) // positive literal
            {
                Vec_IntPush( vLits, pCube->Lits[i] );
                break;
            }
        assert( i < pCube->nLits );
    }
    // generate a starting cube
    pCubeMin  = Pdr_SetCreateSubset( pCube, Vec_IntArray(vLits), Vec_IntSize(vLits) );
    assert( !Pdr_SetIsInit(pCubeMin, -1) );
/*
    // make sure the cube works
    {
    int RetValue;
    RetValue = Pdr_ManCheckCube( p, k, pCubeMin, NULL, 0 );
    assert( RetValue );
    }
*/
    return pCubeMin;
}